

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjMarkAutoBwd_rec(Rtm_Obj_t *pObj)

{
  uint uVar1;
  Rtm_Obj_t *pRVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)&pObj->field_0x8;
  if (((uVar1 & 0x10) == 0) && (*(uint *)&pObj->field_0x8 = uVar1 | 0x10, (uVar1 & 0x7f80) != 0)) {
    pRVar2 = pObj + 1;
    uVar3 = 0;
    do {
      Rtm_ObjMarkAutoBwd_rec((Rtm_Obj_t *)pRVar2->pCopy);
      uVar3 = uVar3 + 1;
      pRVar2 = (Rtm_Obj_t *)&pRVar2->Temp;
    } while (uVar3 < (*(uint *)&pObj->field_0x8 >> 7 & 0xff));
  }
  return;
}

Assistant:

void Rtm_ObjMarkAutoBwd_rec( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i;
    if ( pObj->fAuto )
        return;
    pObj->fAuto = 1;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Rtm_ObjMarkAutoBwd_rec( pFanin );
}